

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::
BinaryExpression<const_std::__detail::_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_false,_true>_&,_(Catch::Internal::Operator)0,_const_std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_false,_true>_&>
::reconstructExpression
          (BinaryExpression<const_std::__detail::_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_false,_true>_&,_(Catch::Internal::Operator)0,_const_std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_false,_true>_&>
           *this,string *dest)

{
  long lVar1;
  string rhs;
  string lhs;
  undefined1 *local_68;
  long local_60;
  undefined1 local_58 [16];
  undefined1 *local_48;
  long local_40;
  undefined1 local_38 [16];
  
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,Detail::unprintableString_abi_cxx11_,
             DAT_0016c8f0 + Detail::unprintableString_abi_cxx11_);
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,Detail::unprintableString_abi_cxx11_,
             DAT_0016c8f0 + Detail::unprintableString_abi_cxx11_);
  if (((ulong)(local_60 + local_40) < 0x28) &&
     (lVar1 = std::__cxx11::string::find((char)&local_48,10), lVar1 == -1)) {
    std::__cxx11::string::find((char)&local_68,10);
  }
  std::__cxx11::string::reserve((ulong)dest);
  std::__cxx11::string::_M_assign((string *)dest);
  std::__cxx11::string::push_back((char)dest);
  std::__cxx11::string::append((char *)dest);
  std::__cxx11::string::push_back((char)dest);
  std::__cxx11::string::_M_append((char *)dest,(ulong)local_68);
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  return;
}

Assistant:

virtual void reconstructExpression( std::string& dest ) const CATCH_OVERRIDE {
        std::string lhs = Catch::toString( m_lhs );
        std::string rhs = Catch::toString( m_rhs );
        char delim = lhs.size() + rhs.size() < 40 &&
                     lhs.find('\n') == std::string::npos &&
                     rhs.find('\n') == std::string::npos ? ' ' : '\n';
        dest.reserve( 7 + lhs.size() + rhs.size() );
                   // 2 for spaces around operator
                   // 2 for operator
                   // 2 for parentheses (conditionally added later)
                   // 1 for negation (conditionally added later)
        dest = lhs;
        dest += delim;
        dest += Internal::OperatorTraits<Op>::getName();
        dest += delim;
        dest += rhs;
    }